

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O2

int secp256k1_borromean_verify
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scalar *evalues,uchar *e0,
              secp256k1_scalar *s,secp256k1_gej *pubs,size_t *rsizes,size_t nrings,uchar *m,
              size_t mlen)

{
  uchar *__s1;
  int iVar1;
  secp256k1_gej *psVar2;
  ulong uVar3;
  secp256k1_scalar *psVar4;
  size_t ridx;
  int overflow;
  long local_218;
  secp256k1_scalar *local_210;
  secp256k1_scalar *local_208;
  secp256k1_scalar *local_200;
  secp256k1_gej *local_1f8;
  secp256k1_scalar *local_1f0;
  secp256k1_gej *local_1e8;
  uchar *local_1e0;
  secp256k1_ecmult_context *local_1d8;
  size_t size;
  secp256k1_scalar ens;
  uchar tmp [33];
  secp256k1_sha256 local_178;
  secp256k1_gej rgej;
  secp256k1_ge rge;
  
  local_178.s[0] = 0x6a09e667;
  local_178.s[1] = 0xbb67ae85;
  local_178.s[2] = 0x3c6ef372;
  local_178.s[3] = 0xa54ff53a;
  local_178.s[4] = 0x510e527f;
  local_178.s[5] = 0x9b05688c;
  local_178.s[6] = 0x1f83d9ab;
  local_178.s[7] = 0x5be0cd19;
  local_178.bytes = 0;
  ridx = 0;
  local_218 = 0;
  local_210 = evalues;
  local_1f0 = s;
  local_1e8 = pubs;
  local_1e0 = e0;
  local_1d8 = ecmult_ctx;
  do {
    __s1 = local_1e0;
    psVar2 = local_1e8;
    psVar4 = local_1f0;
    if (ridx == nrings) {
      secp256k1_sha256_write(&local_178,m,mlen);
      secp256k1_sha256_finalize(&local_178,tmp);
      iVar1 = bcmp(__s1,tmp,0x20);
      return (uint)(iVar1 == 0);
    }
    secp256k1_borromean_hash(tmp,m,mlen,local_1e0,0x20,ridx,0);
    secp256k1_scalar_set_b32(&ens,tmp,&overflow);
    local_208 = local_210 + local_218;
    psVar2 = psVar2 + local_218;
    psVar4 = psVar4 + local_218;
    for (uVar3 = 0; uVar3 < rsizes[ridx]; uVar3 = uVar3 + 1) {
      if (overflow != 0) {
        return 0;
      }
      local_200 = psVar4;
      local_1f8 = psVar2;
      iVar1 = secp256k1_scalar_is_zero(psVar4);
      if (iVar1 != 0) {
        return 0;
      }
      if ((ens.d[3] == 0 && ens.d[1] == 0) && (ens.d[2] == 0 && ens.d[0] == 0)) {
        return 0;
      }
      if (local_1f8->infinity != 0) {
        return 0;
      }
      if (local_210 != (secp256k1_scalar *)0x0) {
        local_208->d[2] = ens.d[2];
        local_208->d[3] = ens.d[3];
        local_208->d[0] = ens.d[0];
        local_208->d[1] = ens.d[1];
      }
      secp256k1_ecmult(local_1d8,&rgej,local_1f8,&ens,local_200);
      if (rgej.infinity != 0) {
        return 0;
      }
      secp256k1_ge_set_gej_var(&rge,&rgej);
      secp256k1_eckey_pubkey_serialize(&rge,tmp,&size,1);
      if (uVar3 == rsizes[ridx] - 1) {
        secp256k1_sha256_write(&local_178,tmp,size);
      }
      else {
        secp256k1_borromean_hash(tmp,m,mlen,tmp,0x21,ridx,uVar3 + 1);
        secp256k1_scalar_set_b32(&ens,tmp,&overflow);
      }
      local_218 = local_218 + 1;
      local_208 = local_208 + 1;
      psVar2 = local_1f8 + 1;
      psVar4 = local_200 + 1;
    }
    ridx = ridx + 1;
  } while( true );
}

Assistant:

int secp256k1_borromean_verify(const secp256k1_ecmult_context* ecmult_ctx, secp256k1_scalar *evalues, const unsigned char *e0,
 const secp256k1_scalar *s, const secp256k1_gej *pubs, const size_t *rsizes, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    count = 0;
    secp256k1_sha256_initialize(&sha256_e0);
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        for (j = 0; j < rsizes[i]; j++) {
            if (overflow || secp256k1_scalar_is_zero(&s[count]) || secp256k1_scalar_is_zero(&ens) || secp256k1_gej_is_infinity(&pubs[count])) {
                return 0;
            }
            if (evalues) {
                /*If requested, save the challenges for proof rewind.*/
                evalues[count] = ens;
            }
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count], &ens, &s[count]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            /* OPT: loop can be hoisted and split to use batch inversion across all the rings; this would make it much faster. */
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            if (j != rsizes[i] - 1) {
                secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
                secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            } else {
                secp256k1_sha256_write(&sha256_e0, tmp, size);
            }
            count++;
        }
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, tmp);
    return memcmp(e0, tmp, 32) == 0;
}